

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro.hpp
# Opt level: O0

void __thiscall Xoshiro::Xoshiro256PP::Xoshiro256PP(Xoshiro256PP *this,uint64_t seed)

{
  Xoshiro256PP *in_RSI;
  uint64_t in_stack_ffffffffffffffe8;
  
  Xoshiro256PP::seed(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

Xoshiro256PP(const uint64_t seed) noexcept
    {
        this->seed(seed);
    }